

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O0

void sysbvm_functionBytecodeAssembler_optimizeJumps
               (sysbvm_context_t *context,sysbvm_functionBytecodeAssembler_t *assembler)

{
  sysbvm_functionBytecodeAssemblerAbstractInstruction_s *psVar1;
  sysbvm_tuple_t array;
  sysbvm_tuple_t array_00;
  _Bool _Var2;
  uint8_t uVar3;
  size_t sVar4;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_s *psVar5;
  sysbvm_tuple_t lastOperand;
  uint8_t opcode;
  sysbvm_functionBytecodeAssemblerInstruction_t *bytecodeInstruction;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_t *nextInstruction;
  sysbvm_functionBytecodeAssemblerAbstractInstruction_t *instruction;
  sysbvm_functionBytecodeAssembler_t *assembler_local;
  sysbvm_context_t *context_local;
  
  psVar1 = assembler->firstInstruction;
  while (nextInstruction = psVar1,
        nextInstruction != (sysbvm_functionBytecodeAssemblerAbstractInstruction_t *)0x0) {
    psVar1 = nextInstruction->next;
    _Var2 = sysbvm_functionBytecodeAssemblerInstruction_isLabel(context,nextInstruction);
    if ((!_Var2) &&
       (((uVar3 = sysbvm_tuple_uint8_decode(nextInstruction[1].super.header.field_0.typePointer),
         uVar3 == '\x11' || (uVar3 == '%')) || (uVar3 == '&')))) {
      array._0_4_ = nextInstruction[1].super.header.identityHashAndFlags;
      array._4_4_ = nextInstruction[1].super.header.objectSize;
      array_00._0_4_ = nextInstruction[1].super.header.identityHashAndFlags;
      array_00._4_4_ = nextInstruction[1].super.header.objectSize;
      sVar4 = sysbvm_array_getSize(array_00);
      psVar5 = (sysbvm_functionBytecodeAssemblerAbstractInstruction_s *)
               sysbvm_array_at(array,sVar4 - 1);
      if (psVar5 == psVar1) {
        sysbvm_functionBytecodeAssembler_removeInstruction(assembler,nextInstruction);
      }
    }
  }
  return;
}

Assistant:

static void sysbvm_functionBytecodeAssembler_optimizeJumps(sysbvm_context_t *context, sysbvm_functionBytecodeAssembler_t *assembler)
{
    sysbvm_functionBytecodeAssemblerAbstractInstruction_t *instruction = assembler->firstInstruction;
    while(instruction)
    {
        sysbvm_functionBytecodeAssemblerAbstractInstruction_t *nextInstruction = instruction->next;
        if(!sysbvm_functionBytecodeAssemblerInstruction_isLabel(context, instruction))
        {
            sysbvm_functionBytecodeAssemblerInstruction_t *bytecodeInstruction = (sysbvm_functionBytecodeAssemblerInstruction_t*)instruction;
            uint8_t opcode = sysbvm_tuple_uint8_decode(bytecodeInstruction->standardOpcode);
            if(opcode == SYSBVM_OPCODE_JUMP || opcode == SYSBVM_OPCODE_JUMP_IF_TRUE || opcode == SYSBVM_OPCODE_JUMP_IF_FALSE)
            {
                sysbvm_tuple_t lastOperand = sysbvm_array_at(bytecodeInstruction->operands, sysbvm_array_getSize(bytecodeInstruction->operands) - 1);
                if(lastOperand == (sysbvm_tuple_t)nextInstruction)
                    sysbvm_functionBytecodeAssembler_removeInstruction(assembler, instruction);
            }
        }

        instruction = nextInstruction;
    }

}